

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterTable.h
# Opt level: O3

Dictionary<int,_int> * __thiscall
MasterTable::initializeDictionary<int,int>
          (MasterTable *this,ion_key_type_t key_type,int k,int v,ion_key_size_t key_size,
          ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
          ion_dictionary_type_t dictionary_type)

{
  ion_dictionary_id_t id;
  ion_err_t iVar1;
  Dictionary<int,_int> *unaff_RBX;
  
  id = ion_master_table_next_id;
  switch(dictionary_type) {
  case dictionary_type_bpp_tree_t:
    unaff_RBX = (Dictionary<int,_int> *)operator_new(0x80);
    BppTree<int,_int>::BppTree((BppTree<int,_int> *)unaff_RBX,id,key_type,key_size,value_size);
    break;
  case dictionary_type_flat_file_t:
    unaff_RBX = (Dictionary<int,_int> *)operator_new(0x80);
    FlatFile<int,_int>::FlatFile
              ((FlatFile<int,_int> *)unaff_RBX,id,key_type,key_size,value_size,dictionary_size);
    break;
  case dictionary_type_open_address_file_hash_t:
    unaff_RBX = (Dictionary<int,_int> *)operator_new(0x80);
    OpenAddressFileHash<int,_int>::OpenAddressFileHash
              ((OpenAddressFileHash<int,_int> *)unaff_RBX,id,key_type,key_size,value_size,
               dictionary_size);
    break;
  case dictionary_type_open_address_hash_t:
    unaff_RBX = (Dictionary<int,_int> *)operator_new(0x80);
    OpenAddressHash<int,_int>::OpenAddressHash
              ((OpenAddressHash<int,_int> *)unaff_RBX,id,key_type,key_size,value_size,
               dictionary_size);
    break;
  case dictionary_type_skip_list_t:
    unaff_RBX = (Dictionary<int,_int> *)operator_new(0x80);
    SkipList<int,_int>::SkipList
              ((SkipList<int,_int> *)unaff_RBX,id,key_type,key_size,value_size,dictionary_size);
    break;
  case dictionary_type_linear_hash_t:
    unaff_RBX = (Dictionary<int,_int> *)operator_new(0x80);
    LinearHash<int,_int>::LinearHash
              ((LinearHash<int,_int> *)unaff_RBX,id,key_type,key_size,value_size,dictionary_size);
    break;
  case dictionary_type_error_t:
    unaff_RBX = (Dictionary<int,_int> *)operator_new(0x80);
    SkipList<int,_int>::SkipList
              ((SkipList<int,_int> *)unaff_RBX,id,key_type,key_size,value_size,dictionary_size);
    goto LAB_001058a5;
  }
  if (((unaff_RBX->dict).status != '\x02') &&
     (iVar1 = addToMasterTable<int,int>(this,unaff_RBX,dictionary_size), iVar1 != '\0')) {
LAB_001058a5:
    (unaff_RBX->dict).status = '\x02';
  }
  return unaff_RBX;
}

Assistant:

Dictionary<K, V> *
initializeDictionary(
	ion_key_type_t			key_type,
	K						k,
	V						v,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	ion_dictionary_size_t	dictionary_size,
	ion_dictionary_type_t	dictionary_type
) {
	UNUSED(k);
	UNUSED(v);

	Dictionary<K, V> *dictionary;

	ion_dictionary_id_t id = ion_master_table_next_id;

	switch (dictionary_type) {
		case dictionary_type_bpp_tree_t: {
			dictionary = new BppTree<K, V>(id, key_type, key_size, value_size);

			break;
		}

		case dictionary_type_flat_file_t: {
			dictionary = new FlatFile<K, V>(id, key_type, key_size, value_size, dictionary_size);

			break;
		}

		case dictionary_type_open_address_file_hash_t: {
			dictionary = new OpenAddressFileHash<K, V>(id, key_type, key_size, value_size, dictionary_size);

			break;
		}

		case dictionary_type_open_address_hash_t: {
			dictionary = new OpenAddressHash<K, V>(id, key_type, key_size, value_size, dictionary_size);

			break;
		}

		case dictionary_type_skip_list_t: {
			dictionary = new SkipList<K, V>(id, key_type, key_size, value_size, dictionary_size);

			break;
		}

		case dictionary_type_linear_hash_t: {
			dictionary = new LinearHash<K, V>(id, key_type, key_size, value_size, dictionary_size);

			break;
		}

		case dictionary_type_error_t: {
			dictionary				= new SkipList<K, V>(id, key_type, key_size, value_size, dictionary_size);
			dictionary->dict.status = ion_dictionary_status_error;
			break;
		}
	}

	if ((dictionary_type != dictionary_type_error_t) && (ion_dictionary_status_error != dictionary->dict.status)) {
		ion_err_t err = addToMasterTable(dictionary, dictionary_size);

		if (err_ok != err) {
			dictionary->dict.status = ion_dictionary_status_error;
		}
	}

	return dictionary;
}